

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

void __thiscall
myvk::QueueSelectionResolver::FetchDeviceQueues(QueueSelectionResolver *this,Ptr<Device> *device)

{
  UniqueQueue *this_00;
  _Rb_tree_color family_index;
  _Base_ptr p_Var1;
  long *plVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  Ptr<UniqueQueue> unique_queue;
  undefined1 local_68 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var7 = (this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68._16_8_ = &(this->m_queue_creations)._M_t._M_impl.super__Rb_tree_header;
  if (p_Var7 != (_Rb_tree_node_base *)local_68._16_8_) {
    this_00 = (UniqueQueue *)(local_68 + 0x28);
    local_68._24_8_ = device;
    do {
      if (p_Var7[1]._M_left != p_Var7[1]._M_parent) {
        family_index = p_Var7[1]._M_color;
        uVar9 = 0;
        local_68._32_8_ = p_Var7;
        do {
          uVar4 = local_68._32_8_;
          UniqueQueue::Create(this_00,(Ptr<Device> *)local_68._24_8_,family_index,(uint32_t)uVar9);
          p_Var1 = (&((_Rb_tree_node_base *)(uVar4 + 0x20))->_M_parent->_M_parent)[uVar9 * 3];
          for (p_Var8 = *(_Base_ptr *)
                         (&((_Rb_tree_node_base *)(uVar4 + 0x20))->_M_parent->_M_color + uVar9 * 6);
              p_Var8 != p_Var1; p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
            plVar2 = *(long **)p_Var8;
            if (plVar2[2] == 0) {
              Queue::Create((Queue *)local_68,(Ptr<UniqueQueue> *)this_00);
            }
            else {
              PresentQueue::Create
                        ((PresentQueue *)local_68,(Ptr<UniqueQueue> *)this_00,
                         (Ptr<Surface> *)(plVar2 + 2));
            }
            uVar5 = local_68._8_8_;
            uVar4 = local_68._0_8_;
            puVar3 = (undefined8 *)*plVar2;
            local_68._0_8_ = (_func_int **)0x0;
            local_68._8_8_ = (element_type *)0x0;
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
            *puVar3 = uVar4;
            puVar3[1] = uVar5;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
            }
          }
          if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
          }
          uVar9 = (ulong)((uint32_t)uVar9 + 1);
          uVar6 = ((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_68._32_8_ + 0x30))
                         ->_vptr__Sp_counted_base -
                   (long)((_Rb_tree_node_base *)(local_68._32_8_ + 0x20))->_M_parent >> 3) *
                  -0x5555555555555555;
          p_Var7 = (_Rb_tree_node_base *)local_68._32_8_;
        } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)local_68._16_8_);
  }
  return;
}

Assistant:

void QueueSelectionResolver::FetchDeviceQueues(const Ptr<Device> &device) const {
	for (const auto &creation : m_queue_creations) {
		uint32_t family = creation.first;
		for (uint32_t index = 0; index < creation.second.size(); ++index) {
			Ptr<UniqueQueue> unique_queue = UniqueQueue::Create(device, family, index);
			for (QueueSelection *selection : creation.second[index]) {
				if (selection->IsPresentQueue())
					selection->GetPresentQueueTargetRef() =
					    PresentQueue::Create(unique_queue, selection->GetSurfacePtr());
				else {
					selection->GetQueueTargetRef() = Queue::Create(unique_queue);
				}
			}
		}
	}
}